

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  char *buffer;
  ulong srcSize;
  char *dst_00;
  uint local_64;
  void *local_60;
  size_t local_58;
  char *local_50;
  uint local_44;
  short *local_40;
  size_t local_38;
  
  if (workspaceSize < 0x2c0) {
    return 0xffffffffffffffff;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  *(undefined1 *)((long)workspace + 0x1b4) = 0;
  uVar2 = huffLog + 1;
  if (1 < uVar2) {
    lVar5 = 0;
    do {
      *(char *)((long)workspace + lVar5 + 0x1b5) = (char)huffLog;
      lVar5 = lVar5 + 1;
      huffLog = (uint)(byte)((char)huffLog - 1);
    } while ((ulong)uVar2 - 1 != lVar5);
  }
  srcSize = (ulong)maxSymbolValue;
  if (maxSymbolValue != 0) {
    uVar3 = 0;
    do {
      *(undefined1 *)((long)workspace + uVar3 + 0x1c1) =
           *(undefined1 *)((long)workspace + (ulong)CTable[uVar3].nbBits + 0x1b4);
      uVar3 = uVar3 + 1;
    } while (srcSize != uVar3);
  }
  buffer = (char *)((long)dst + 1);
  local_60 = (void *)((long)workspace + 0x1c1);
  local_64 = 0xc;
  if (maxSymbolValue < 2) {
    uVar3 = 0;
  }
  else {
    local_58 = maxDstSize;
    local_50 = (char *)dst;
    uVar2 = HIST_count_simple((uint *)((long)workspace + 0x164),&local_64,local_60,srcSize);
    uVar6 = (ulong)(uVar2 == maxSymbolValue);
    maxDstSize = local_58;
    dst = local_50;
    uVar3 = uVar6;
    if (uVar2 != maxSymbolValue && uVar2 != 1) {
      local_44 = FSE_optimalTableLog(6,srcSize,local_64);
      local_40 = (short *)((long)workspace + 0x198);
      uVar3 = FSE_normalizeCount(local_40,local_44,(uint *)((long)workspace + 0x164),srcSize,
                                 local_64,0);
      maxDstSize = local_58;
      dst = local_50;
      if (uVar3 < 0xffffffffffffff89) {
        local_38 = local_58 - 1;
        sVar4 = FSE_writeNCount(buffer,local_38,local_40,local_64,local_44);
        maxDstSize = local_58;
        dst = local_50;
        uVar3 = sVar4;
        if ((sVar4 < 0xffffffffffffff89) &&
           (uVar3 = FSE_buildCTable_wksp
                              ((FSE_CTable *)workspace,local_40,local_64,local_44,
                               (void *)((long)workspace + 0xec),0x78), maxDstSize = local_58,
           dst = local_50, uVar3 < 0xffffffffffffff89)) {
          dst_00 = buffer + sVar4;
          uVar3 = FSE_compress_usingCTable
                            (dst_00,local_38 - sVar4,local_60,srcSize,(FSE_CTable *)workspace);
          if (uVar3 < 0xffffffffffffff89) {
            if (uVar3 == 0) {
              bVar1 = false;
              uVar3 = 0;
            }
            else {
              dst_00 = dst_00 + uVar3;
              bVar1 = true;
              uVar3 = uVar6;
            }
          }
          else {
            bVar1 = false;
          }
          maxDstSize = local_58;
          dst = local_50;
          if (bVar1) {
            uVar3 = (long)dst_00 - (long)buffer;
          }
        }
      }
    }
  }
  if (uVar3 < 0xffffffffffffff89) {
    if (maxSymbolValue >> 1 <= uVar3 || uVar3 < 2) {
      bVar1 = true;
      goto LAB_0067b7b0;
    }
    *(char *)dst = (char)uVar3;
    uVar3 = uVar3 + 1;
  }
  bVar1 = false;
LAB_0067b7b0:
  if ((bVar1) && (uVar3 = 0xffffffffffffffff, maxSymbolValue < 0x81)) {
    uVar6 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
    uVar3 = 0xffffffffffffffba;
    if (uVar6 <= maxDstSize) {
      *(char *)dst = (char)maxSymbolValue + '\x7f';
      *(undefined1 *)((long)local_60 + srcSize) = 0;
      uVar3 = uVar6;
      if (maxSymbolValue != 0) {
        uVar6 = 0;
        do {
          *buffer = *(char *)((long)workspace + uVar6 + 0x1c1) * '\x10' +
                    *(char *)((long)workspace + uVar6 + 0x1c2);
          uVar6 = uVar6 + 2;
          buffer = buffer + 1;
        } while (uVar6 < srcSize);
      }
    }
  }
  return uVar3;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)workspace;

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}